

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v6::internal::
     handle_dynamic_spec<fmt::v6::internal::width_checker,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
               (int *value,arg_ref<char> ref,
               basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
               *ctx)

{
  unsigned_long_long uVar1;
  format_arg *__return_storage_ptr__;
  error_handler local_81;
  width_checker<fmt::v6::internal::error_handler> local_80;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  format_arg local_58;
  format_arg local_38;
  
  if (ref.kind == name) {
    __return_storage_ptr__ = &local_58;
    basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::arg
              (__return_storage_ptr__,ctx,ref.val.name);
  }
  else {
    if (ref.kind != index) {
      return;
    }
    __return_storage_ptr__ = &local_38;
    basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::get(__return_storage_ptr__,&ctx->args_,ref.val.index);
  }
  local_78.long_long_value = (__return_storage_ptr__->value_).field_0.long_long_value;
  local_78.string.size = (__return_storage_ptr__->value_).field_0.string.size;
  local_68 = *(undefined8 *)&__return_storage_ptr__->type_;
  uStack_60 = *(undefined8 *)&__return_storage_ptr__->field_0x18;
  local_80.handler_ = &local_81;
  uVar1 = visit_format_arg<fmt::v6::internal::width_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                    (&local_80,
                     (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_78.string);
  if ((uVar1 & 0xffffffff80000000) == 0) {
    *value = (int)uVar1;
    return;
  }
  error_handler::on_error(&local_81,"number is too big");
}

Assistant:

void handle_dynamic_spec(int& value, arg_ref<typename Context::char_type> ref,
                         Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = internal::get_dynamic_spec<Handler>(ctx.arg(ref.val.index),
                                                ctx.error_handler());
    break;
  case arg_id_kind::name:
    value = internal::get_dynamic_spec<Handler>(ctx.arg(ref.val.name),
                                                ctx.error_handler());
    break;
  }
}